

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_gen_keys.c
# Opt level: O2

int main(void)

{
  ulong *puVar1;
  int iVar2;
  size_t i;
  long lVar3;
  ulp_ring_private_key *priv_key;
  ulp_ring_public_key *pub_key;
  
  pub_key = (ulp_ring_public_key *)0x0;
  priv_key = (ulp_ring_private_key *)0x0;
  iVar2 = ulp_ring_generate_key_pair(0x100,0x1da7e,0x1fe2f37,0x3f8c027d93dd95,&pub_key,&priv_key);
  if ((((pub_key != (ulp_ring_public_key *)0x0 && iVar2 == 0) && (pub_key->n == 0x100)) &&
      (pub_key->q == 0x3f8c027d93dd95)) &&
     ((pub_key->se == 0x1fe2f37 && (pub_key->a != (uint64_t *)0x0)))) {
    if (((priv_key != (ulp_ring_private_key *)0x0 && pub_key->p != (uint64_t *)0x0) &&
        ((priv_key->n == 0x100 && (priv_key->q == 0x3f8c027d93dd95)))) &&
       (priv_key->s != (uint64_t *)0x0)) {
      lVar3 = 0;
      do {
        if (lVar3 == 0x100) {
          ulp_ring_free_public_key(pub_key);
          iVar2 = 0;
          goto LAB_00101261;
        }
      } while (((pub_key->a[lVar3] < 0x3f8c027d93dd95) && (pub_key->p[lVar3] < 0x3f8c027d93dd95)) &&
              (puVar1 = priv_key->s + lVar3, lVar3 = lVar3 + 1, *puVar1 < 0x1da7e));
    }
  }
  ulp_ring_free_public_key(pub_key);
  iVar2 = 1;
LAB_00101261:
  ulp_ring_free_private_key(priv_key);
  return iVar2;
}

Assistant:

int main() {

    ulp_ring_public_key* pub_key = NULL;
    ulp_ring_private_key* priv_key = NULL;

    size_t n = 256;
    uint64_t sk = 121470;
    uint64_t se = 33435447;
    uint64_t q = 17886865857437077;

    // generate key pair and do sanity checks

    if(ulp_ring_generate_key_pair(n, sk, se, q, &pub_key, &priv_key) != 0)
        goto error;

    if(pub_key == NULL || pub_key->n != n || pub_key->q != q || pub_key->se != se || pub_key->a == NULL || pub_key->p == NULL)
        goto error;

    if(priv_key == NULL || priv_key->n != n || priv_key->q != q || priv_key->s == NULL)
        goto error;

    // check if values are below thresholds

    for(size_t i = 0; i < n; i++) {
        if(pub_key->a[i] >= q || pub_key->p[i] >= q || priv_key->s[i] >= sk)
            goto error;
    }

    ulp_ring_free_public_key(pub_key);
    ulp_ring_free_private_key(priv_key);
    return 0;


    error:
        ulp_ring_free_public_key(pub_key);
        ulp_ring_free_private_key(priv_key);
        return 1;

}